

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_negotiate(telnet_t *telnet,uchar cmd,int telopt)

{
  byte bVar1;
  byte him;
  uint uVar2;
  telnet_rfc1143_t tVar3;
  int in_ECX;
  uint uVar4;
  uchar uVar5;
  byte bStackY_30;
  uchar bytes [3];
  
  if (0x1ff < telopt) {
    _error(telnet,0x546,"telnet_negotiate",TELNET_EBADVAL,0,
           "supplied telopt %d for negotiation is greater than 511",telopt);
switchD_0010259a_default:
    return;
  }
  if ((telnet->flags & 1) != 0) {
    bytes[0] = 0xff;
    bytes[1] = cmd;
    bytes[2] = (uchar)telopt;
    _send((int)telnet,bytes,3,in_ECX);
    return;
  }
  tVar3 = _get_rfc1143(telnet,telopt);
  uVar2 = tVar3._4_4_;
  bVar1 = tVar3.state;
  switch(cmd) {
  case 0xfb:
    if ((uVar2 & 0xf) == 5) {
      him = (byte)(uVar2 >> 4) & 0xf;
      bStackY_30 = 3;
    }
    else {
      if ((uVar2 & 0xf) != 2) {
        if (((ulong)tVar3 & 0xf00000000) != 0) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x03',(byte)(uVar2 >> 4) & 0xf);
        if (telopt < 0x100) {
          uVar5 = 0xfb;
LAB_00102777:
          _send_negotiate(telnet,uVar5,(uchar)telopt);
          return;
        }
        uVar5 = 0xfb;
LAB_001026d5:
        _exopl_send_negotiate(telnet,uVar5,telopt);
        return;
      }
      him = (byte)(uVar2 >> 4) & 0xf;
      bStackY_30 = 4;
    }
    goto LAB_00102738;
  case 0xfc:
    uVar4 = uVar2 & 0xf;
    if (uVar4 == 4) {
      him = (byte)(uVar2 >> 4) & 0xf;
      bStackY_30 = 2;
    }
    else {
      if (uVar4 != 3) {
        if (uVar4 != 1) {
          return;
        }
        _set_rfc1143(telnet,telopt,'\x02',(byte)(uVar2 >> 4) & 0xf);
        if (telopt < 0x100) {
          uVar5 = 0xfc;
          goto LAB_00102777;
        }
        uVar5 = 0xfc;
        goto LAB_001026d5;
      }
      him = (byte)(uVar2 >> 4) & 0xf;
      bStackY_30 = 5;
    }
    goto LAB_00102738;
  case 0xfd:
    uVar2 = uVar2 >> 4 & 0xf;
    if (uVar2 == 5) {
      bStackY_30 = 3;
    }
    else {
      if (uVar2 != 2) {
        if (uVar2 != 0) {
          return;
        }
        _set_rfc1143(telnet,telopt,bVar1 & 0xf,'\x03');
        if (telopt < 0x100) {
          uVar5 = 0xfd;
          goto LAB_00102777;
        }
        uVar5 = 0xfd;
        goto LAB_001026d5;
      }
      bStackY_30 = 4;
    }
    break;
  case 0xfe:
    uVar2 = uVar2 >> 4 & 0xf;
    if (uVar2 == 4) {
      bStackY_30 = 2;
    }
    else {
      if (uVar2 != 3) {
        if (uVar2 != 1) {
          return;
        }
        _set_rfc1143(telnet,telopt,bVar1 & 0xf,'\x02');
        if (telopt < 0x100) {
          uVar5 = 0xfe;
          goto LAB_00102777;
        }
        uVar5 = 0xfe;
        goto LAB_001026d5;
      }
      bStackY_30 = 5;
    }
    break;
  default:
    goto switchD_0010259a_default;
  }
  him = bStackY_30;
  bStackY_30 = bVar1 & 0xf;
LAB_00102738:
  _set_rfc1143(telnet,telopt,bStackY_30,him);
  return;
}

Assistant:

void telnet_negotiate(telnet_t *telnet, unsigned char cmd,
		int telopt) {
	telnet_rfc1143_t q;

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for negotiation is greater than 511", telopt);
		return;
	}

	/* if we're in proxy mode, just send it now */
	if (telnet->flags & TELNET_FLAG_PROXY) {
		unsigned char bytes[3];
		bytes[0] = TELNET_IAC;
		bytes[1] = cmd;
		bytes[2] = (unsigned char)telopt;
		_sendu(telnet, bytes, 3);
		return;
	}

	/* get current option states */
	q = _get_rfc1143(telnet, telopt);

	switch (cmd) {
	/* advertise willingess to support an option */
	case TELNET_WILL:
		switch (Q_US(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			SEND_NEGOTIATION(telnet, TELNET_WILL, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_WANTNO_OP, Q_HIM(q));
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_WANTYES, Q_HIM(q));
			break;
		}
		break;

	/* force turn-off of locally enabled option */
	case TELNET_WONT:
		switch (Q_US(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			SEND_NEGOTIATION(telnet, TELNET_WONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_WANTYES_OP, Q_HIM(q));
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_WANTNO, Q_HIM(q));
			break;
		}
		break;

	/* ask remote end to enable an option */
	case TELNET_DO:
		switch (Q_HIM(q)) {
		case Q_NO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			SEND_NEGOTIATION(telnet, TELNET_DO, telopt);
			break;
		case Q_WANTNO:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO_OP);
			break;
		case Q_WANTYES_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES);
			break;
		}
		break;

	/* demand remote end disable an option */
	case TELNET_DONT:
		switch (Q_HIM(q)) {
		case Q_YES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			SEND_NEGOTIATION(telnet, TELNET_DONT, telopt);
			break;
		case Q_WANTYES:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTYES_OP);
			break;
		case Q_WANTNO_OP:
			_set_rfc1143(telnet, telopt, Q_US(q), Q_WANTNO);
			break;
		}
		break;
	}
}